

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x993390;
  *(undefined8 *)&this->field_0x38 = 0x9934a8;
  *(undefined8 *)&this[-1].field_0xd8 = 0x9933b8;
  *(undefined8 *)&this[-1].field_0xe8 = 0x9933e0;
  *(undefined8 *)&this[-1].field_0x120 = 0x993408;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x993430;
  *(undefined8 *)&this[-1].field_0x188 = 0x993458;
  *(undefined8 *)this = 0x993480;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__009934c8);
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}